

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

bool TCV::isMatchType(string *lhs,string *rhs)

{
  bool bVar1;
  string *rhs_local;
  string *lhs_local;
  
  bVar1 = std::operator==(rhs,"integer");
  if (((bVar1) && (bVar1 = std::operator==(lhs,"intnum"), bVar1)) ||
     ((bVar1 = std::operator==(rhs,"intnum"), bVar1 &&
      (bVar1 = std::operator==(lhs,"integer"), bVar1)))) {
    lhs_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(rhs,"float");
    if (((bVar1) && (bVar1 = std::operator==(lhs,"floatnum"), bVar1)) ||
       ((bVar1 = std::operator==(rhs,"floatnum"), bVar1 &&
        (bVar1 = std::operator==(lhs,"float"), bVar1)))) {
      lhs_local._7_1_ = true;
    }
    else {
      lhs_local._7_1_ = std::operator==(rhs,lhs);
    }
  }
  return lhs_local._7_1_;
}

Assistant:

bool TCV::isMatchType(const std::string &lhs, const std::string &rhs) {
    if ((rhs == "integer" && lhs == "intnum") || (rhs == "intnum" && lhs == "integer")) return true;
    else if ((rhs == "float" && lhs == "floatnum") || (rhs == "floatnum" && lhs == "float")) return true;
    else return rhs == lhs;
}